

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall OpenMPDirective::generateDOT(OpenMPDirective *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OpenMPDirectiveKind OVar2;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar3;
  OpenMPClause *pOVar4;
  bool bVar5;
  ostream *poVar6;
  pointer ppOVar7;
  SourceLocation *pSVar8;
  ulong uVar9;
  pointer ppOVar10;
  int local_4e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  string tkind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  string node_id_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  OpenMPDirective *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator<char> local_411;
  string indent;
  string current_line;
  string list_name;
  string expr_name;
  string combiner;
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string directive_kind;
  string node_id;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250 [32];
  ofstream output;
  
  directive_kind._M_dataplus._M_p = (pointer)&directive_kind.field_2;
  directive_kind._M_string_length = 0;
  directive_kind.field_2._M_local_buf[0] = '\0';
  OVar2 = this->kind;
  switch(OVar2) {
  case OMPD_for_simd:
    goto LAB_0014e488;
  case OMPD_do_simd:
    goto LAB_0014e488;
  case OMPD_parallel_for_simd:
    goto LAB_0014e488;
  default:
    toString_abi_cxx11_((string *)&output,this);
    std::__cxx11::string::operator=((string *)&directive_kind,(string *)&output);
    std::__cxx11::string::~string((string *)&output);
    goto LAB_0014e4bd;
  case OMPD_declare_simd:
    goto LAB_0014e488;
  case OMPD_distribute_simd:
    goto LAB_0014e488;
  case OMPD_distribute_parallel_for:
    goto LAB_0014e488;
  case OMPD_distribute_parallel_do:
    goto LAB_0014e488;
  case OMPD_distribute_parallel_for_simd:
    goto LAB_0014e488;
  case OMPD_distribute_parallel_do_simd:
    goto LAB_0014e488;
  case OMPD_cancellation_point:
    goto LAB_0014e488;
  case OMPD_declare_reduction:
    goto LAB_0014e488;
  case OMPD_declare_mapper:
    goto LAB_0014e488;
  case OMPD_parallel_for:
    goto LAB_0014e488;
  case OMPD_parallel_do:
    goto LAB_0014e488;
  case OMPD_parallel_loop:
    goto LAB_0014e488;
  case OMPD_parallel_sections:
    goto LAB_0014e488;
  case OMPD_parallel_workshare:
    break;
  case OMPD_parallel_master:
    break;
  case OMPD_master_taskloop:
    break;
  case OMPD_master_taskloop_simd:
    break;
  case OMPD_parallel_master_taskloop:
    break;
  case OMPD_parallel_master_taskloop_simd:
    break;
  case OMPD_taskloop_simd:
    goto LAB_0014e488;
  case OMPD_target_data:
    goto LAB_0014e488;
  case OMPD_target_enter_data:
    goto LAB_0014e488;
  case OMPD_target_update:
    goto LAB_0014e488;
  case OMPD_target_exit_data:
    goto LAB_0014e488;
  case OMPD_declare_target:
    goto LAB_0014e488;
  case OMPD_end_declare_target:
LAB_0014e488:
    std::__cxx11::string::assign((char *)&directive_kind);
    goto LAB_0014e4bd;
  case OMPD_teams_distribute:
    break;
  case OMPD_teams_distribute_simd:
    break;
  case OMPD_teams_distribute_parallel_for:
    break;
  case OMPD_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_loop:
    break;
  case OMPD_target_parallel:
    break;
  case OMPD_target_parallel_for:
    break;
  case OMPD_target_parallel_for_simd:
    break;
  case OMPD_target_parallel_loop:
    break;
  case OMPD_target_simd:
    break;
  case OMPD_target_teams:
    break;
  case OMPD_target_teams_distribute:
    break;
  case OMPD_target_teams_distribute_simd:
    break;
  case OMPD_target_teams_loop:
    break;
  case OMPD_target_teams_distribute_parallel_for:
    break;
  case OMPD_target_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_distribute_parallel_do:
    break;
  case OMPD_teams_distribute_parallel_do_simd:
    break;
  case OMPD_target_parallel_do:
    break;
  case OMPD_target_parallel_do_simd:
    break;
  case OMPD_target_teams_distribute_parallel_do:
    break;
  case OMPD_target_teams_distribute_parallel_do_simd:
  }
  std::__cxx11::string::append((char *)&directive_kind);
LAB_0014e4bd:
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  std::operator+(&filename,"graph OpenMPIR_",&directive_kind);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                 &filename," {\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&output);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::substr((ulong)&node_id,(ulong)&directive_kind);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                 "OpenMPIR_",&node_id);
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,".dot"
                );
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&node_id);
  std::ofstream::ofstream(&output,filename._M_dataplus._M_p,_S_out);
  std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
  poVar6 = std::operator<<((ostream *)&output,"\t");
  poVar6 = std::operator<<(poVar6,directive_kind._M_dataplus._M_p);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node_id,"",(allocator<char> *)&indent);
  paVar1 = &indent.field_2;
  if (OVar2 == OMPD_declare_simd) {
    indent._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&indent,'\x01');
    std::__cxx11::string::string((string *)&id,(string *)(this + 1));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&combiner,"declare_simd",(allocator<char> *)&list_name);
    std::operator+(&list_name,&combiner,"_proc_name");
    bVar5 = std::operator!=(&id,"");
    if (bVar5) {
      std::operator+(&local_4a0,&indent,&combiner);
      std::operator+(&node_id_1,&local_4a0," -- ");
      std::operator+(&tkind,&node_id_1,&list_name);
      std::operator+(&expr_name,&tkind,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
      std::__cxx11::string::~string((string *)&expr_name);
      std::__cxx11::string::~string((string *)&tkind);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
      std::operator+(&local_438,&indent,"\t");
      std::operator+(&local_460,&local_438,&list_name);
      std::operator+(&local_4e0,&local_460," [label = \"");
      std::operator+(&local_4a0,&local_4e0,&list_name);
      std::operator+(&node_id_1,&local_4a0,"\\n ");
      std::operator+(&tkind,&node_id_1,&id);
      std::operator+(&expr_name,&tkind,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
      std::__cxx11::string::~string((string *)&expr_name);
      std::__cxx11::string::~string((string *)&tkind);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_438);
      std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
    }
LAB_0014fa45:
    std::__cxx11::string::~string((string *)&list_name);
    std::__cxx11::string::~string((string *)&combiner);
    std::__cxx11::string::~string((string *)&id);
LAB_0014fa74:
    std::__cxx11::string::~string((string *)&indent);
  }
  else {
    if (OVar2 == OMPD_allocate) {
      indent._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&indent,'\x01');
      id._M_dataplus._M_p = (pointer)&id.field_2;
      id._M_string_length = 0;
      id.field_2._M_local_buf[0] = '\0';
      combiner._M_dataplus._M_p = (pointer)&combiner.field_2;
      combiner._M_string_length = 0;
      combiner.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&list_name,"allocate",(allocator<char> *)&expr_name);
      std::operator+(&tkind,&list_name,"_directive_list_");
      std::__cxx11::to_string(&node_id_1,0);
      std::operator+(&expr_name,&tkind,&node_id_1);
      std::__cxx11::string::operator=((string *)&id,(string *)&expr_name);
      std::__cxx11::string::~string((string *)&expr_name);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&tkind);
      std::operator+(&local_4a0,&indent,&list_name);
      std::operator+(&node_id_1,&local_4a0," -- ");
      std::operator+(&tkind,&node_id_1,&id);
      std::operator+(&expr_name,&tkind,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
      std::__cxx11::string::~string((string *)&expr_name);
      std::__cxx11::string::~string((string *)&tkind);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
      pSVar8 = *(SourceLocation **)&this[1].super_SourceLocation;
      local_4e4 = 0;
      local_440 = this;
      for (; pSVar8 != local_440[1].super_SourceLocation.parent_construct;
          pSVar8 = (SourceLocation *)&pSVar8->parent_construct) {
        std::operator+(&tkind,&id,"_expr");
        std::__cxx11::to_string(&node_id_1,local_4e4);
        std::operator+(&expr_name,&tkind,&node_id_1);
        std::__cxx11::string::operator=((string *)&combiner,(string *)&expr_name);
        std::__cxx11::string::~string((string *)&expr_name);
        std::__cxx11::string::~string((string *)&node_id_1);
        std::__cxx11::string::~string((string *)&tkind);
        std::operator+(&local_4e0,&indent,&indent);
        std::operator+(&local_4a0,&local_4e0,&id);
        std::operator+(&node_id_1,&local_4a0," -- ");
        std::operator+(&tkind,&node_id_1,&combiner);
        std::operator+(&expr_name,&tkind,"\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
        std::__cxx11::string::~string((string *)&expr_name);
        std::__cxx11::string::~string((string *)&tkind);
        std::__cxx11::string::~string((string *)&node_id_1);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
        std::operator+(&local_350,&indent,&indent);
        std::operator+(&local_438,&local_350,"\t");
        std::operator+(&local_460,&local_438,&combiner);
        std::operator+(&local_4e0,&local_460," [label = \"");
        std::operator+(&local_4a0,&local_4e0,&combiner);
        std::operator+(&node_id_1,&local_4a0,"\\n ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,*(char **)pSVar8,(allocator<char> *)&local_310);
        std::operator+(&tkind,&node_id_1,&local_330);
        std::operator+(&expr_name,&tkind,"\"]\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
        std::__cxx11::string::~string((string *)&expr_name);
        std::__cxx11::string::~string((string *)&tkind);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&node_id_1);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_350);
        std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
        local_4e4 = local_4e4 + 1;
      }
    }
    else {
      if (OVar2 != OMPD_threadprivate) {
        if (OVar2 == OMPD_declare_reduction) {
          indent._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)&indent,'\x01');
          std::__cxx11::string::string((string *)&id,(string *)&this[1].clauses_in_original_order);
          std::__cxx11::string::string
                    ((string *)&combiner,
                     (string *)&this[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    );
          list_name._M_dataplus._M_p = (pointer)&list_name.field_2;
          list_name._M_string_length = 0;
          list_name.field_2._M_local_buf[0] = '\0';
          expr_name._M_dataplus._M_p = (pointer)&expr_name.field_2;
          expr_name._M_string_length = 0;
          expr_name.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tkind,"declare_reduction",(allocator<char> *)&node_id_1);
          std::operator+(&node_id_1,&tkind,"_reduction_identifier");
          std::operator+(&local_438,&indent,&tkind);
          std::operator+(&local_460,&local_438," -- ");
          std::operator+(&local_4e0,&local_460,&node_id_1);
          std::operator+(&local_4a0,&local_4e0,"\n");
          std::__cxx11::string::operator=((string *)&current_line,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_438);
          std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
          std::operator+(&local_310,&indent,"\t");
          std::operator+(&local_330,&local_310,&node_id_1);
          std::operator+(&local_350,&local_330," [label = \"");
          std::operator+(&local_438,&local_350,&node_id_1);
          std::operator+(&local_460,&local_438,"\\n ");
          std::operator+(&local_4e0,&local_460,&id);
          std::operator+(&local_4a0,&local_4e0,"\"]\n");
          std::__cxx11::string::operator=((string *)&current_line,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_310);
          std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
          std::operator+(&local_4e0,&tkind,"_typename_list_");
          std::__cxx11::to_string(&local_460,0);
          std::operator+(&local_4a0,&local_4e0,&local_460);
          std::__cxx11::string::operator=((string *)&list_name,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::operator+(&local_438,&indent,&tkind);
          std::operator+(&local_460,&local_438," -- ");
          std::operator+(&local_4e0,&local_460,&list_name);
          std::operator+(&local_4a0,&local_4e0,"\n");
          std::__cxx11::string::operator=((string *)&current_line,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_438);
          std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
          pSVar8 = *(SourceLocation **)&this[1].super_SourceLocation;
          local_4e4 = 0;
          local_440 = this;
          for (; pSVar8 != local_440[1].super_SourceLocation.parent_construct;
              pSVar8 = (SourceLocation *)&pSVar8->parent_construct) {
            std::operator+(&local_4e0,&list_name,"_expr");
            std::__cxx11::to_string(&local_460,local_4e4);
            std::operator+(&local_4a0,&local_4e0,&local_460);
            std::__cxx11::string::operator=((string *)&expr_name,(string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::operator+(&local_350,&indent,&indent);
            std::operator+(&local_438,&local_350,&list_name);
            std::operator+(&local_460,&local_438," -- ");
            std::operator+(&local_4e0,&local_460,&expr_name);
            std::operator+(&local_4a0,&local_4e0,"\n");
            std::__cxx11::string::operator=((string *)&current_line,(string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_350);
            std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
            std::operator+(&local_270,&indent,&indent);
            std::operator+(&local_310,&local_270,"\t");
            std::operator+(&local_330,&local_310,&expr_name);
            std::operator+(&local_350,&local_330," [label = \"");
            std::operator+(&local_438,&local_350,&expr_name);
            std::operator+(&local_460,&local_438,"\\n ");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_290,*(char **)pSVar8,&local_411);
            std::operator+(&local_4e0,&local_460,&local_290);
            std::operator+(&local_4a0,&local_4e0,"\"]\n");
            std::__cxx11::string::operator=((string *)&current_line,(string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_350);
            std::__cxx11::string::~string((string *)&local_330);
            std::__cxx11::string::~string((string *)&local_310);
            std::__cxx11::string::~string((string *)&local_270);
            std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
            local_4e4 = local_4e4 + 1;
          }
          std::operator+(&local_4a0,&tkind,"_combiner");
          std::__cxx11::string::operator=((string *)&node_id_1,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::operator+(&local_438,&indent,&tkind);
          this = local_440;
          std::operator+(&local_460,&local_438," -- ");
          std::operator+(&local_4e0,&local_460,&node_id_1);
          std::operator+(&local_4a0,&local_4e0,"\n");
          std::__cxx11::string::operator=((string *)&current_line,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_438);
          std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
          std::operator+(&local_310,&indent,"\t");
          std::operator+(&local_330,&local_310,&node_id_1);
          std::operator+(&local_350,&local_330," [label = \"");
          std::operator+(&local_438,&local_350,&node_id_1);
          std::operator+(&local_460,&local_438,"\\n ");
          std::operator+(&local_4e0,&local_460,&combiner);
          std::operator+(&local_4a0,&local_4e0,"\"]\n");
          std::__cxx11::string::operator=((string *)&current_line,(string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_310);
          std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&node_id_1);
          std::__cxx11::string::~string((string *)&tkind);
          std::__cxx11::string::~string((string *)&expr_name);
          goto LAB_0014fa45;
        }
        std::__cxx11::string::substr((ulong)&indent,(ulong)&directive_kind);
        std::__cxx11::string::operator=((string *)&node_id,(string *)&indent);
        goto LAB_0014fa74;
      }
      indent._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&indent,'\x01');
      id._M_dataplus._M_p = (pointer)&id.field_2;
      id._M_string_length = 0;
      id.field_2._M_local_buf[0] = '\0';
      combiner._M_dataplus._M_p = (pointer)&combiner.field_2;
      combiner._M_string_length = 0;
      combiner.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&list_name,"threadprivate",(allocator<char> *)&expr_name);
      std::operator+(&tkind,&list_name,"_directive_list_");
      std::__cxx11::to_string(&node_id_1,0);
      std::operator+(&expr_name,&tkind,&node_id_1);
      std::__cxx11::string::operator=((string *)&id,(string *)&expr_name);
      std::__cxx11::string::~string((string *)&expr_name);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&tkind);
      std::operator+(&local_4a0,&indent,&list_name);
      std::operator+(&node_id_1,&local_4a0," -- ");
      std::operator+(&tkind,&node_id_1,&id);
      std::operator+(&expr_name,&tkind,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
      std::__cxx11::string::~string((string *)&expr_name);
      std::__cxx11::string::~string((string *)&tkind);
      std::__cxx11::string::~string((string *)&node_id_1);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
      pSVar8 = *(SourceLocation **)&this[1].super_SourceLocation;
      local_4e4 = 0;
      local_440 = this;
      for (; pSVar8 != local_440[1].super_SourceLocation.parent_construct;
          pSVar8 = (SourceLocation *)&pSVar8->parent_construct) {
        std::operator+(&tkind,&id,"_expr");
        std::__cxx11::to_string(&node_id_1,local_4e4);
        std::operator+(&expr_name,&tkind,&node_id_1);
        std::__cxx11::string::operator=((string *)&combiner,(string *)&expr_name);
        std::__cxx11::string::~string((string *)&expr_name);
        std::__cxx11::string::~string((string *)&node_id_1);
        std::__cxx11::string::~string((string *)&tkind);
        std::operator+(&local_4e0,&indent,&indent);
        std::operator+(&local_4a0,&local_4e0,&id);
        std::operator+(&node_id_1,&local_4a0," -- ");
        std::operator+(&tkind,&node_id_1,&combiner);
        std::operator+(&expr_name,&tkind,"\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
        std::__cxx11::string::~string((string *)&expr_name);
        std::__cxx11::string::~string((string *)&tkind);
        std::__cxx11::string::~string((string *)&node_id_1);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
        std::operator+(&local_350,&indent,&indent);
        std::operator+(&local_438,&local_350,"\t");
        std::operator+(&local_460,&local_438,&combiner);
        std::operator+(&local_4e0,&local_460," [label = \"");
        std::operator+(&local_4a0,&local_4e0,&combiner);
        std::operator+(&node_id_1,&local_4a0,"\\n ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,*(char **)pSVar8,(allocator<char> *)&local_310);
        std::operator+(&tkind,&node_id_1,&local_330);
        std::operator+(&expr_name,&tkind,"\"]\n");
        std::__cxx11::string::operator=((string *)&current_line,(string *)&expr_name);
        std::__cxx11::string::~string((string *)&expr_name);
        std::__cxx11::string::~string((string *)&tkind);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&node_id_1);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_350);
        std::operator<<((ostream *)&output,current_line._M_dataplus._M_p);
        local_4e4 = local_4e4 + 1;
      }
    }
    std::__cxx11::string::~string((string *)&list_name);
    std::__cxx11::string::~string((string *)&combiner);
    std::__cxx11::string::~string((string *)&id);
    std::__cxx11::string::~string((string *)&indent);
    this = local_440;
  }
  pvVar3 = this->clauses_in_original_order;
  ppOVar10 = (pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppOVar7 = (pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar7 != ppOVar10) {
    uVar9 = 0;
    for (; ppOVar10 != ppOVar7; ppOVar10 = ppOVar10 + 1) {
      pOVar4 = *ppOVar10;
      std::__cxx11::string::string(local_250,(string *)&node_id);
      (*pOVar4->_vptr_OpenMPClause[1])(pOVar4,&output,1,uVar9,local_250);
      std::__cxx11::string::~string(local_250);
      uVar9 = (ulong)((int)uVar9 + 1);
      ppOVar7 = (pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  std::operator<<((ostream *)&output,"}\n");
  std::__cxx11::string::~string((string *)&node_id);
  std::ofstream::~ofstream(&output);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&current_line);
  std::__cxx11::string::~string((string *)&directive_kind);
  return;
}

Assistant:

void OpenMPDirective::generateDOT() {
    std::string directive_kind;
    OpenMPDirectiveKind kind = this->getKind();
    switch(kind) {
        case OMPD_cancellation_point :
                directive_kind = "cancellation_point " ;
                break;
        case OMPD_for_simd:
                directive_kind = "for_simd ";
                break;
        case OMPD_do_simd:
                directive_kind = "do_simd ";
                break;
        case OMPD_parallel_for_simd:
                directive_kind = "parallel_for_simd ";
                break;
        case OMPD_declare_simd:
                directive_kind = "declare_simd ";
                break;
        case OMPD_distribute_simd:
                directive_kind = "distribute_simd ";
                break;
        case OMPD_distribute_parallel_for:
                directive_kind = "distribute_parallel_for ";
                break;
        case OMPD_distribute_parallel_do:
                directive_kind = "distribute_parallel_do ";
                break;
        case OMPD_distribute_parallel_for_simd:
                directive_kind = "distribute_parallel_for_simd ";
                break;
        case OMPD_distribute_parallel_do_simd:
                directive_kind = "distribute_parallel_do_simd ";
                break;
        case OMPD_parallel_for:
                directive_kind = "parallel_for ";
                break;
        case OMPD_parallel_do:
                directive_kind = "parallel_do ";
                break;
        case OMPD_parallel_loop:
                directive_kind = "parallel_loop ";
                break;
        case OMPD_parallel_sections:
                directive_kind = "parallel_sections ";
                break;
        case OMPD_parallel_workshare:
                directive_kind += "parallel_workshare ";
                break;
        case OMPD_parallel_master:
                directive_kind += "parallel_master ";
                break;
        case OMPD_master_taskloop:
                directive_kind += "master_taskloop ";
                break;
        case OMPD_master_taskloop_simd:
                directive_kind += "master_taskloop_simd ";
                break;
        case OMPD_parallel_master_taskloop:
                directive_kind += "parallel_master_taskloop ";
                break;
        case OMPD_parallel_master_taskloop_simd:
                directive_kind += "parallel_master_taskloop_simd ";
                break;
        case OMPD_declare_reduction:
                directive_kind = "declare_reduction ";
                break;
        case OMPD_declare_mapper:
                directive_kind = "declare_mapper ";
                break;
        case OMPD_taskloop_simd:
                directive_kind = "taskloop_simd ";
                break;
        case OMPD_target_data:
                directive_kind = "target_data ";
                break;
        case OMPD_target_enter_data:
                directive_kind = "target_enter_data ";
                break;
        case OMPD_target_exit_data:
                directive_kind = "target_exit_data ";
                break;
        case OMPD_target_update:
                directive_kind = "target_update ";
                break;
        case OMPD_declare_target:
                directive_kind = "declare_target ";
                break;
        case OMPD_end_declare_target:
                directive_kind = "end_declare_target ";
                break;
        case OMPD_teams_distribute:
                directive_kind += "teams_distribute ";
                break;
        case OMPD_teams_distribute_simd:
                directive_kind += "teams_distribute_simd ";
                break;
        case OMPD_teams_distribute_parallel_for:
                directive_kind += "teams_distribute_parallel_for ";
                break;
        case OMPD_teams_distribute_parallel_for_simd:
                directive_kind += "teams_distribute_parallel_for_simd ";
                break;
        case OMPD_teams_loop:
                directive_kind += "teams_loop ";
                break;
        case OMPD_target_parallel:
                directive_kind += "target_parallel ";
                break;
        case OMPD_target_parallel_for:
                directive_kind += "target_parallel_for ";
                break;
        case OMPD_target_parallel_for_simd:
                directive_kind += "target_parallel_for_simd ";
                break;
        case OMPD_target_parallel_loop:
                directive_kind += "target_parallel_loop ";
                break;
        case OMPD_target_simd:
                directive_kind += "target_simd ";
                break;
        case OMPD_target_teams:
                directive_kind += "target_teams ";
                break;
        case OMPD_target_teams_distribute:
                directive_kind += "target_teams_distribute ";
                break;
        case OMPD_target_teams_distribute_simd:
                directive_kind += "target_teams_distribute_simd ";
                break;
        case OMPD_target_teams_loop:
                directive_kind += "target_teams_loop ";
                break;
        case OMPD_target_teams_distribute_parallel_for:
                directive_kind += "target_teams_distribute_parallel_for ";
                break;
        case OMPD_target_teams_distribute_parallel_for_simd:
                directive_kind += "target_teams_distribute_parallel_for simd ";
                break;
        case OMPD_teams_distribute_parallel_do:
                directive_kind += "teams distribute parallel do ";
                break;
        case OMPD_teams_distribute_parallel_do_simd:
                directive_kind += "teams distribute parallel do simd ";
                break;
        case OMPD_target_parallel_do:
                directive_kind += "target parallel do ";
                break;
        case OMPD_target_parallel_do_simd:
                directive_kind += "target parallel do simd ";
                break;
        case OMPD_target_teams_distribute_parallel_do:
                directive_kind += "target teams distribute parallel do ";
                break;
        case OMPD_target_teams_distribute_parallel_do_simd:
                directive_kind += "target teams distribute parallel do simd ";
                break;
        default:
                directive_kind = this->toString();
    }
    std::string current_line;

    current_line = "graph OpenMPIR_" + directive_kind + " {\n";

    std::string filename = "OpenMPIR_" + directive_kind.substr(0, directive_kind.size() - 1) + ".dot";
    std::ofstream output(filename.c_str());

    output << current_line.c_str();
    output << "\t" << directive_kind.c_str() << "\n";
    std::string node_id = "";
    switch (kind) {
        case OMPD_allocate: {
            std::string indent = std::string(1, '\t');
            std::vector<const char *> *list = ((OpenMPAllocateDirective *) this)->getAllocateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "allocate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
           break;
        }
        case OMPD_threadprivate: {
            std::string indent = std::string(1, '\t');
            std::vector<const char *> *list = ((OpenMPThreadprivateDirective*)this)->getThreadprivateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "threadprivate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
           break;
        }
        case OMPD_declare_reduction: {
            std::string indent = std::string(1, '\t');
            std::vector<const char*>* list = ((OpenMPDeclareReductionDirective*)this)->getTypenameList();
            std::vector<const char*>::iterator list_item;
            std::string id = ((OpenMPDeclareReductionDirective*)this)->getIdentifier();
            std::string combiner = ((OpenMPDeclareReductionDirective*)this)->getCombiner();
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "declare_reduction";
            std::string node_id = tkind + "_reduction_identifier";
            current_line = indent + tkind + " -- " + node_id + "\n";
            output << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + id + "\"]\n";
            output << current_line.c_str();
            list_name = tkind + "_typename_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
            node_id = tkind + "_combiner";
            current_line = indent + tkind + " -- " + node_id + "\n";
            output << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + combiner + "\"]\n";
            output << current_line.c_str();
           break;
        }
        case OMPD_declare_simd: {
            std::string indent = std::string(1, '\t');
            std::string proc_name = ((OpenMPDeclareSimdDirective*)this)->getProcName();
            std::string tkind = "declare_simd";
            std::string node_id = tkind + "_proc_name";
            if (proc_name != ""){
              current_line = indent + tkind + " -- " + node_id + "\n";
              output << current_line.c_str();
              current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + proc_name + "\"]\n";
              output << current_line.c_str();
            }
           break;
        }
        default: {
            node_id = directive_kind.substr(0, directive_kind.size() - 1);
        }
    };

    std::vector<OpenMPClause*>* clauses = this->getClausesInOriginalOrder();
    if (clauses->size() != 0) {
        std::vector<OpenMPClause*>::iterator iter;
        int clause_index = 0;
        for (iter = clauses->begin(); iter != clauses->end(); iter++) {
            (*iter)->generateDOT(output, 1, clause_index, node_id);
            clause_index += 1;
        };
    };

    output << "}\n";

}